

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

RunResult __thiscall
wabt::interp::Thread::DoConvert<unsigned_int,double>(Thread *this,Ptr *out_trap)

{
  double dVar1;
  Value VVar2;
  
  VVar2 = Pop(this);
  dVar1 = (double)VVar2.f64_;
  if (NAN(dVar1)) {
    DoConvert<unsigned_int,double>();
  }
  else {
    if ((-1.0 < dVar1) && (dVar1 <= 4294967295.0)) {
      VVar2._0_8_ = (long)dVar1 & 0xffffffff;
      Push(this,VVar2);
      return Ok;
    }
    DoConvert<unsigned_int,double>();
  }
  return Trap;
}

Assistant:

RunResult Thread::DoConvert(Trap::Ptr* out_trap) {
  auto val = Pop<T>();
  if (std::is_integral<R>::value && std::is_floating_point<T>::value) {
    // Don't use std::isnan here because T may be a non-floating-point type.
    TRAP_IF(IsNaN(val), "invalid conversion to integer");
  }
  TRAP_UNLESS(CanConvert<R>(val), "integer overflow");
  Push<R>(Convert<R>(val));
  return RunResult::Ok;
}